

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::anon_unknown_103::GetDefaultVisitor::visit<slang::ast::GenericClassDefSymbol>
          (ConstantValue *__return_storage_ptr__,GetDefaultVisitor *this,GenericClassDefSymbol *type
          )

{
  logic_error *this_00;
  string local_f8;
  allocator<char> local_c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  GenericClassDefSymbol *local_20;
  GenericClassDefSymbol *type_local;
  GetDefaultVisitor *this_local;
  
  local_20 = type;
  type_local = (GenericClassDefSymbol *)this;
  this_local = (GetDefaultVisitor *)__return_storage_ptr__;
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/types/Type.cpp"
             ,&local_c1);
  std::operator+(&local_a0,&local_c0,":");
  std::__cxx11::to_string(&local_f8,0x27);
  std::operator+(&local_80,&local_a0,&local_f8);
  std::operator+(&local_60,&local_80,": ");
  std::operator+(&local_40,&local_60,"Default case should be unreachable!");
  std::logic_error::logic_error(this_00,(string *)&local_40);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

ConstantValue visit([[maybe_unused]] const T& type) {
        if constexpr (is_detected_v<getDefault_t, T>) {
            return type.getDefaultValueImpl();
        }
        else {
            ASSUME_UNREACHABLE;
        }
    }